

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_4.cxx
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_c [2];
  int a;
  
  local_c[0] = 10;
  calc(local_c,a_func);
  poVar1 = std::operator<<((ostream *)&std::cout,"a_func = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_c[0] = 10;
  calc(local_c,b_func);
  poVar1 = std::operator<<((ostream *)&std::cout,"b_func = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(){
    int a= 10;

    calc(&a,a_func);
    std::cout << "a_func = " << a << std::endl;

    a = 10;
    calc(&a,b_func);
    std::cout << "b_func = " << a << std::endl;
}